

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_str.c
# Opt level: O0

adt_str_encoding_t adt_utf8_checkEncodingAndSize(uint8_t *strBuf,int32_t maxBufLen,int32_t *strSize)

{
  byte bVar1;
  int local_38;
  adt_str_encoding_t local_32;
  int32_t size;
  adt_str_encoding_t retval;
  uint8_t c;
  uint8_t *p;
  int32_t *strSize_local;
  int32_t maxBufLen_local;
  uint8_t *strBuf_local;
  
  if (((strBuf == (uint8_t *)0x0) || (maxBufLen < 0)) || (strSize == (int32_t *)0x0)) {
    strBuf_local._7_1_ = '\0';
  }
  else {
    local_32 = '\x01';
    _size = strBuf;
    for (local_38 = 0; maxBufLen == 0 || local_38 < maxBufLen; local_38 = local_38 + 1) {
      bVar1 = *_size;
      if (bVar1 == 0) break;
      if ((local_32 == '\x01') && (0x7f < bVar1)) {
        if (((bVar1 & 0xf8) == 0xf0) || (((bVar1 & 0xf0) == 0xe0 || ((bVar1 & 0xe0) == 0xc0)))) {
          local_32 = '\x02';
        }
        else {
          local_32 = '\x03';
        }
      }
      _size = _size + 1;
    }
    *strSize = local_38;
    strBuf_local._7_1_ = local_32;
  }
  return strBuf_local._7_1_;
}

Assistant:

DYN_STATIC adt_str_encoding_t adt_utf8_checkEncodingAndSize(const uint8_t *strBuf, int32_t maxBufLen, int32_t *strSize)
{
   if ( (strBuf == 0) || (maxBufLen < 0) || (strSize == 0) )
   {
      return ADT_STR_ENCODING_UNKNOWN;
   }
   const uint8_t *p = strBuf;
   uint8_t c = 0;
   adt_str_encoding_t retval = ADT_STR_ENCODING_ASCII;
   int32_t size = 0;
   while( (maxBufLen == 0) || (size < maxBufLen))
   {
      c = *p++;
      if (c == 0)
      {
         break;
      }
      else if ( (retval == ADT_STR_ENCODING_ASCII) && (c > 127) )
      {
         if ( ( (c & 0xf8) == 0xf0) || ( (c & 0xf0) == 0xe0) || ( (c & 0xe0) == 0xc0) )
         {
            retval = ADT_STR_ENCODING_UTF8;
         }
         else
         {
            retval = ADT_STR_ENCODING_UTF16; //this is a guess
         }
      }
      size++;
   }
   *strSize = size;
   return retval;
}